

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<float>::Reserve(RepeatedField<float> *this,int new_size)

{
  int *piVar1;
  ArenaImpl *pAVar2;
  ArenaImpl *pAVar3;
  float *pfVar4;
  int in_ESI;
  int *in_RDI;
  float *limit;
  float *e;
  int old_total_size;
  size_t bytes;
  Arena *arena;
  Rep *new_rep;
  Rep *old_rep;
  size_t n;
  undefined4 in_stack_fffffffffffffe08;
  int in_stack_fffffffffffffe0c;
  LogMessage *in_stack_fffffffffffffe10;
  Rep *in_stack_fffffffffffffe18;
  Arena *in_stack_fffffffffffffe20;
  Arena *n_00;
  RepeatedField<float> *in_stack_fffffffffffffe70;
  Rep *local_180;
  float *local_168;
  int local_fc;
  Arena *local_f8;
  undefined8 *local_f0;
  Rep *local_e8;
  int local_dc [8];
  byte local_b9;
  ArenaImpl *local_80;
  Arena *local_78;
  undefined8 *local_70;
  size_t local_68;
  byte local_49;
  Rep local_48 [3];
  ArenaImpl *local_10;
  Arena *local_8;
  
  if (in_RDI[1] < in_ESI) {
    if (in_RDI[1] < 1) {
      local_180 = (Rep *)0x0;
    }
    else {
      local_180 = rep((RepeatedField<float> *)in_stack_fffffffffffffe10);
    }
    local_e8 = local_180;
    local_f8 = GetArenaNoVirtual((RepeatedField<float> *)in_stack_fffffffffffffe10);
    local_fc = in_RDI[1] << 1;
    piVar1 = std::max<int>(&local_fc,local_dc);
    piVar1 = std::max<int>(&internal::kMinRepeatedFieldAllocationSize,piVar1);
    local_dc[0] = *piVar1;
    pAVar2 = (ArenaImpl *)((long)local_dc[0] * 4 + 8);
    if (local_f8 == (Arena *)0x0) {
      local_f0 = (undefined8 *)operator_new((ulong)pAVar2);
    }
    else {
      local_78 = local_f8;
      local_80 = pAVar2;
      pAVar3 = (ArenaImpl *)std::numeric_limits<unsigned_long>::max();
      local_b9 = 0;
      if (pAVar3 < pAVar2) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)in_stack_fffffffffffffe20,
                   (LogLevel_conflict)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                   (char *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
        local_b9 = 1;
        internal::LogMessage::operator<<
                  (in_stack_fffffffffffffe10,
                   (char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        internal::LogMessage::operator<<
                  (in_stack_fffffffffffffe10,
                   (char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        internal::LogFinisher::operator=
                  ((LogFinisher *)in_stack_fffffffffffffe10,
                   (LogMessage *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      }
      if ((local_b9 & 1) != 0) {
        internal::LogMessage::~LogMessage((LogMessage *)0x3e2965);
      }
      if (local_78 == (Arena *)0x0) {
        local_70 = (undefined8 *)operator_new__((ulong)local_80);
      }
      else {
        local_8 = local_78;
        local_10 = local_80;
        n_00 = local_78;
        pAVar2 = local_80;
        pAVar3 = (ArenaImpl *)std::numeric_limits<unsigned_long>::max();
        local_49 = 0;
        if (pAVar3 < pAVar2) {
          in_stack_fffffffffffffe18 = local_48;
          internal::LogMessage::LogMessage
                    ((LogMessage *)in_stack_fffffffffffffe20,
                     (LogLevel_conflict)((ulong)in_stack_fffffffffffffe18 >> 0x20),
                     (char *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
          local_49 = 1;
          in_stack_fffffffffffffe20 =
               (Arena *)internal::LogMessage::operator<<
                                  (in_stack_fffffffffffffe10,
                                   (char *)CONCAT44(in_stack_fffffffffffffe0c,
                                                    in_stack_fffffffffffffe08));
          in_stack_fffffffffffffe10 =
               internal::LogMessage::operator<<
                         (in_stack_fffffffffffffe10,
                          (char *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
          internal::LogFinisher::operator=
                    ((LogFinisher *)in_stack_fffffffffffffe10,
                     (LogMessage *)CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
        }
        if ((local_49 & 1) != 0) {
          internal::LogMessage::~LogMessage((LogMessage *)0x3e2aa9);
        }
        local_68 = internal::AlignUpTo8((size_t)local_10);
        Arena::AllocHook(in_stack_fffffffffffffe20,(type_info *)in_stack_fffffffffffffe18,
                         (size_t)in_stack_fffffffffffffe10);
        local_70 = (undefined8 *)internal::ArenaImpl::AllocateAligned(pAVar2,(size_t)n_00);
      }
      local_f0 = local_70;
    }
    *local_f0 = local_f8;
    in_RDI[1] = local_dc[0];
    *(undefined8 **)(in_RDI + 2) = local_f0 + 1;
    local_168 = elements(in_stack_fffffffffffffe70);
    pfVar4 = local_168 + in_RDI[1];
    for (; local_168 < pfVar4; local_168 = local_168 + 1) {
    }
    if (0 < *in_RDI) {
      elements(in_stack_fffffffffffffe70);
      MoveArray((RepeatedField<float> *)in_stack_fffffffffffffe20,(float *)in_stack_fffffffffffffe18
                ,(float *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe0c);
    }
    InternalDeallocate((RepeatedField<float> *)in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                       (int)((ulong)in_stack_fffffffffffffe10 >> 0x20));
  }
  return;
}

Assistant:

void RepeatedField<Element>::Reserve(int new_size) {
  if (total_size_ >= new_size) return;
  Rep* old_rep = total_size_ > 0 ? rep() : NULL;
  Rep* new_rep;
  Arena* arena = GetArenaNoVirtual();
  new_size = std::max(internal::kMinRepeatedFieldAllocationSize,
                      std::max(total_size_ * 2, new_size));
  GOOGLE_DCHECK_LE(
      static_cast<size_t>(new_size),
      (std::numeric_limits<size_t>::max() - kRepHeaderSize) / sizeof(Element))
      << "Requested size is too large to fit into size_t.";
  size_t bytes =
      kRepHeaderSize + sizeof(Element) * static_cast<size_t>(new_size);
  if (arena == NULL) {
    new_rep = static_cast<Rep*>(::operator new(bytes));
  } else {
    new_rep = reinterpret_cast<Rep*>(Arena::CreateArray<char>(arena, bytes));
  }
  new_rep->arena = arena;
  int old_total_size = total_size_;
  total_size_ = new_size;
  arena_or_elements_ = new_rep->elements;
  // Invoke placement-new on newly allocated elements. We shouldn't have to do
  // this, since Element is supposed to be POD, but a previous version of this
  // code allocated storage with "new Element[size]" and some code uses
  // RepeatedField with non-POD types, relying on constructor invocation. If
  // Element has a trivial constructor (e.g., int32), gcc (tested with -O2)
  // completely removes this loop because the loop body is empty, so this has no
  // effect unless its side-effects are required for correctness.
  // Note that we do this before MoveArray() below because Element's copy
  // assignment implementation will want an initialized instance first.
  Element* e = &elements()[0];
  Element* limit = e + total_size_;
  for (; e < limit; e++) {
    new (e) Element;
  }
  if (current_size_ > 0) {
    MoveArray(&elements()[0], old_rep->elements, current_size_);
  }

  // Likewise, we need to invoke destructors on the old array.
  InternalDeallocate(old_rep, old_total_size);

}